

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  string *content_type;
  size_t in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  Request *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [32];
  string *local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  get_header_value(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  local_10 = local_30;
  lVar1 = std::__cxx11::string::rfind((char *)local_10,0x2a5833);
  std::__cxx11::string::~string(local_30);
  return (bool)((lVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}